

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O1

void __thiscall
capnp::compiler::ModuleLoader::Impl::addImportPath(Impl *this,ReadableDirectory *dir)

{
  RemoveConst<const_kj::ReadableDirectory_*> **pppRVar1;
  ReadableDirectory **ppRVar2;
  ReadableDirectory **ppRVar3;
  size_t newSize;
  
  ppRVar2 = (this->searchPath).builder.endPtr;
  if ((this->searchPath).builder.pos == ppRVar2) {
    ppRVar3 = (this->searchPath).builder.ptr;
    newSize = 4;
    if (ppRVar2 != ppRVar3) {
      newSize = (long)ppRVar2 - (long)ppRVar3 >> 2;
    }
    kj::Vector<const_kj::ReadableDirectory_*>::setCapacity(&this->searchPath,newSize);
  }
  *(this->searchPath).builder.pos = dir;
  pppRVar1 = &(this->searchPath).builder.pos;
  *pppRVar1 = *pppRVar1 + 1;
  return;
}

Assistant:

void addImportPath(const kj::ReadableDirectory& dir) {
    searchPath.add(&dir);
  }